

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall testing::internal::ExpectationBase::RetireAllPreRequisites(ExpectationBase *this)

{
  bool bVar1;
  const_iterator this_00;
  pointer this_01;
  linked_ptr<testing::internal::ExpectationBase> *this_02;
  ExpectationBase *this_03;
  ExpectationSet *in_RDI;
  ExpectationBase *prerequisite;
  const_iterator it;
  ExpectationBase *in_stack_ffffffffffffffe0;
  _Self local_18;
  
  bVar1 = is_retired(in_stack_ffffffffffffffe0);
  if (!bVar1) {
    this_00 = ExpectationSet::begin(in_RDI);
    while( true ) {
      local_18._M_node = (_Base_ptr)ExpectationSet::end(in_RDI);
      bVar1 = std::operator!=((_Self *)&stack0xfffffffffffffff0,&local_18);
      if (!bVar1) break;
      this_01 = std::_Rb_tree_const_iterator<testing::Expectation>::operator->
                          ((_Rb_tree_const_iterator<testing::Expectation> *)0x133225);
      this_02 = Expectation::expectation_base(this_01);
      this_03 = linked_ptr<testing::internal::ExpectationBase>::get(this_02);
      bVar1 = is_retired(this_03);
      if (!bVar1) {
        RetireAllPreRequisites((ExpectationBase *)this_00._M_node);
        Retire(this_03);
      }
      std::_Rb_tree_const_iterator<testing::Expectation>::operator++
                ((_Rb_tree_const_iterator<testing::Expectation> *)this_03);
    }
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  if (is_retired()) {
    // We can take this short-cut as we never retire an expectation
    // until we have retired all its pre-requisites.
    return;
  }

  for (ExpectationSet::const_iterator it = immediate_prerequisites_.begin();
       it != immediate_prerequisites_.end(); ++it) {
    ExpectationBase* const prerequisite = it->expectation_base().get();
    if (!prerequisite->is_retired()) {
      prerequisite->RetireAllPreRequisites();
      prerequisite->Retire();
    }
  }
}